

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::_::Deferred<kj::Function<void()>>>
          (Promise<void> *this,Deferred<kj::Function<void_()>_> *attachments)

{
  PromiseBase PVar1;
  Maybe<kj::Function<void_()>_> *in_RDX;
  PromiseBase local_48;
  Deferred<kj::Function<void_()>_> local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  Maybe<kj::Function<void_()>_>::Maybe(&local_40.maybeFunc,in_RDX);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void()>>>,kj::_::PromiseDisposer,kj::_::Deferred<kj::Function<void()>>>
            ((PromiseDisposer *)&local_48,(OwnPromiseNode *)attachments,&local_40);
  PVar1.node.ptr = local_48.node.ptr;
  local_48.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_>,_kj::_::PromiseDisposer>
  ::dispose((Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_>,_kj::_::PromiseDisposer>
             *)&local_48);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}